

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_helper_polar<ExchCXX::BuiltinB88>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,host_buffer_type eps)

{
  double in_RCX;
  double in_RDX;
  double in_RSI;
  int in_EDI;
  double *sigma_i;
  double *rho_i;
  int32_t i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  undefined4 in_stack_fffffffffffffff8;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    gga_screening_interface<ExchCXX::BuiltinB88>::eval_exc_polar
              ((double)sigma_i,(double)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_RSI,in_RDX,
               in_RCX,(double *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

GGA_EXC_GENERATOR( host_eval_exc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;


    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], eps[i] );

  }

}